

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O2

void __thiscall
icu_63::SpoofImpl::addScriptChars
          (SpoofImpl *this,char *locale,UnicodeSet *allowedChars,UErrorCode *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  UnicodeSet tmpSet;
  UScriptCode scripts [30];
  
  uVar1 = uscript_getCode_63(locale,scripts,0x1e,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (*status == U_USING_DEFAULT_WARNING) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeSet::UnicodeSet(&tmpSet);
      uVar2 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        UnicodeSet::applyIntPropertyValue(&tmpSet,UCHAR_SCRIPT,scripts[uVar2],status);
        UnicodeSet::addAll(allowedChars,&tmpSet);
      }
      UnicodeSet::~UnicodeSet(&tmpSet);
    }
  }
  return;
}

Assistant:

void SpoofImpl::addScriptChars(const char *locale, UnicodeSet *allowedChars, UErrorCode &status) {
    UScriptCode scripts[30];

    int32_t numScripts = uscript_getCode(locale, scripts, UPRV_LENGTHOF(scripts), &status);
    if (U_FAILURE(status)) {
        return;
    }
    if (status == U_USING_DEFAULT_WARNING) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    UnicodeSet tmpSet;
    int32_t    i;
    for (i=0; i<numScripts; i++) {
        tmpSet.applyIntPropertyValue(UCHAR_SCRIPT, scripts[i], status);
        allowedChars->addAll(tmpSet);
    }
}